

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlTestReporter.cpp
# Opt level: O2

void __thiscall
UnitTest::XmlTestReporter::AddFailure(XmlTestReporter *this,ostream *os,DeferredTestResult *result)

{
  int iVar1;
  ostream *poVar2;
  pointer ppVar3;
  string escapedMessage;
  string message;
  string local_1a8 [11];
  
  std::operator<<(os,">");
  for (ppVar3 = (result->failures).
                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar3 != (result->failures).
                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar3 = ppVar3 + 1) {
    std::__cxx11::string::string((string *)&escapedMessage,(string *)&ppVar3->second);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,"&amp;",(allocator<char> *)&message);
    anon_unknown.dwarf_8587a::ReplaceChar(&escapedMessage,'&',local_1a8);
    std::__cxx11::string::~string((string *)local_1a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,"&lt;",(allocator<char> *)&message);
    anon_unknown.dwarf_8587a::ReplaceChar(&escapedMessage,'<',local_1a8);
    std::__cxx11::string::~string((string *)local_1a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,"&gt;",(allocator<char> *)&message);
    anon_unknown.dwarf_8587a::ReplaceChar(&escapedMessage,'>',local_1a8);
    std::__cxx11::string::~string((string *)local_1a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,"&apos;",(allocator<char> *)&message);
    anon_unknown.dwarf_8587a::ReplaceChar(&escapedMessage,'\'',local_1a8);
    std::__cxx11::string::~string((string *)local_1a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,"&quot;",(allocator<char> *)&message);
    anon_unknown.dwarf_8587a::ReplaceChar(&escapedMessage,'\"',local_1a8);
    std::__cxx11::string::~string((string *)local_1a8);
    iVar1 = ppVar3->first;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar2 = std::operator<<((ostream *)local_1a8,(string *)&result->failureFile);
    poVar2 = std::operator<<(poVar2,"(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,") : ");
    std::operator<<(poVar2,(string *)&escapedMessage);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    poVar2 = std::operator<<(os,"<failure");
    poVar2 = std::operator<<(poVar2," message=\"");
    poVar2 = std::operator<<(poVar2,(string *)&message);
    poVar2 = std::operator<<(poVar2,"\"");
    std::operator<<(poVar2,"/>");
    std::__cxx11::string::~string((string *)&message);
    std::__cxx11::string::~string((string *)&escapedMessage);
  }
  return;
}

Assistant:

void XmlTestReporter::AddFailure(std::ostream& os, DeferredTestResult const& result)
{
    os << ">"; // close <test> element

    for (DeferredTestResult::FailureVec::const_iterator it = result.failures.begin(); 
         it != result.failures.end(); 
         ++it)
    {
        string const escapedMessage = XmlEscape(it->second);
        string const message = BuildFailureMessage(result.failureFile, it->first, escapedMessage);

        os << "<failure" << " message=\"" << message << "\"" << "/>";
    }
}